

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaElementDecl.cpp
# Opt level: O3

XMLAttDefList * __thiscall xercesc_4_0::SchemaElementDecl::getAttDefList(SchemaElementDecl *this)

{
  XMLAttDefList *pXVar1;
  RuntimeException *this_00;
  
  if (this->fComplexTypeInfo != (ComplexTypeInfo *)0x0) {
    pXVar1 = ComplexTypeInfo::getAttDefList(this->fComplexTypeInfo);
    return pXVar1;
  }
  this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
  RuntimeException::RuntimeException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/SchemaElementDecl.cpp"
             ,0x78,DV_InvalidOperation,(this->super_XMLElementDecl).fMemoryManager);
  __cxa_throw(this_00,&RuntimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

XMLAttDefList& SchemaElementDecl::getAttDefList() const
{
    if (!fComplexTypeInfo)
	{
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::DV_InvalidOperation, getMemoryManager());
    }

	return fComplexTypeInfo->getAttDefList();
}